

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_subset_format(bcf_hdr_t *hdr,bcf1_t *rec)

{
  bcf_dec_t *pbVar1;
  bcf_fmt_t *pbVar2;
  bcf_dec_t *dec;
  uint8_t *src;
  uint8_t *dst;
  uint8_t *ptr;
  int j;
  int i;
  bcf1_t *rec_local;
  bcf_hdr_t *hdr_local;
  
  if (hdr->keep_samples != (uint8_t *)0x0) {
    if (hdr->n[2] == 0) {
      *(ulong *)&rec->field_0x10 = *(ulong *)&rec->field_0x10 & 0xffffffffff;
      (rec->indiv).l = 0;
    }
    else {
      dst = (uint8_t *)(rec->indiv).s;
      src = (uint8_t *)0x0;
      pbVar1 = &rec->d;
      if (pbVar1->m_fmt < (int)((uint)((ulong)*(undefined8 *)&rec->field_0x10 >> 0x20) & 0xff)) {
        pbVar1->m_fmt = (uint)((ulong)*(undefined8 *)&rec->field_0x10 >> 0x20) & 0xff;
        pbVar1->m_fmt = pbVar1->m_fmt + -1;
        pbVar1->m_fmt = pbVar1->m_fmt >> 1 | pbVar1->m_fmt;
        pbVar1->m_fmt = pbVar1->m_fmt >> 2 | pbVar1->m_fmt;
        pbVar1->m_fmt = pbVar1->m_fmt >> 4 | pbVar1->m_fmt;
        pbVar1->m_fmt = pbVar1->m_fmt >> 8 | pbVar1->m_fmt;
        pbVar1->m_fmt = pbVar1->m_fmt >> 0x10 | pbVar1->m_fmt;
        pbVar1->m_fmt = pbVar1->m_fmt + 1;
        pbVar2 = (bcf_fmt_t *)realloc((rec->d).fmt,(long)pbVar1->m_fmt << 5);
        (rec->d).fmt = pbVar2;
      }
      for (ptr._4_4_ = 0; ptr._4_4_ < pbVar1->m_fmt; ptr._4_4_ = ptr._4_4_ + 1) {
        pbVar2 = (rec->d).fmt;
        *(uint *)&pbVar2[ptr._4_4_].field_0x1c = *(uint *)&pbVar2[ptr._4_4_].field_0x1c & 0x7fffffff
        ;
      }
      for (ptr._4_4_ = 0;
          ptr._4_4_ < (int)((uint)((ulong)*(undefined8 *)&rec->field_0x10 >> 0x20) & 0xff);
          ptr._4_4_ = ptr._4_4_ + 1) {
        dst = bcf_unpack_fmt_core1
                        (dst,(uint)((ulong)*(undefined8 *)&rec->field_0x10 >> 0x28),
                         (rec->d).fmt + ptr._4_4_);
        dec = (bcf_dec_t *)((rec->d).fmt[ptr._4_4_].p + -(long)(rec->d).fmt[ptr._4_4_].size);
        if (src != (uint8_t *)0x0) {
          memmove((rec->d).fmt[ptr._4_4_ + -1].p + (rec->d).fmt[ptr._4_4_ + -1].p_len,
                  (rec->d).fmt[ptr._4_4_].p +
                  -(long)(int)(*(uint *)&(rec->d).fmt[ptr._4_4_].field_0x1c & 0x7fffffff),
                  (ulong)(*(uint *)&(rec->d).fmt[ptr._4_4_].field_0x1c & 0x7fffffff));
          (rec->d).fmt[ptr._4_4_].p =
               (rec->d).fmt[ptr._4_4_ + -1].p +
               (long)(int)(*(uint *)&(rec->d).fmt[ptr._4_4_].field_0x1c & 0x7fffffff) +
               (ulong)(rec->d).fmt[ptr._4_4_ + -1].p_len;
        }
        src = (rec->d).fmt[ptr._4_4_].p;
        for (ptr._0_4_ = 0; (int)ptr < hdr->nsamples_ori; ptr._0_4_ = (int)ptr + 1) {
          dec = (bcf_dec_t *)((long)&dec->m_fmt + (long)(rec->d).fmt[ptr._4_4_].size);
          if (((uint)hdr->keep_samples[(int)ptr / 8] & 1 << ((byte)((long)(int)ptr % 8) & 0x1f)) !=
              0) {
            memmove(src,dec,(long)(rec->d).fmt[ptr._4_4_].size);
            src = src + (rec->d).fmt[ptr._4_4_].size;
          }
        }
        (rec->indiv).l =
             (rec->indiv).l -
             ((ulong)(rec->d).fmt[ptr._4_4_].p_len - ((long)src - (long)(rec->d).fmt[ptr._4_4_].p));
        (rec->d).fmt[ptr._4_4_].p_len = (int)src - (int)(rec->d).fmt[ptr._4_4_].p;
      }
      rec->unpacked = rec->unpacked | 8;
      *(ulong *)&rec->field_0x10 =
           *(ulong *)&rec->field_0x10 & 0xffffffffff | (ulong)(uint)hdr->n[2] << 0x28;
    }
  }
  return 0;
}

Assistant:

int bcf_subset_format(const bcf_hdr_t *hdr, bcf1_t *rec)
{
    if ( !hdr->keep_samples ) return 0;
    if ( !bcf_hdr_nsamples(hdr) )
    {
        rec->indiv.l = rec->n_sample = 0;
        return 0;
    }

    int i, j;
    uint8_t *ptr = (uint8_t*)rec->indiv.s, *dst = NULL, *src;
    bcf_dec_t *dec = &rec->d;
    hts_expand(bcf_fmt_t, rec->n_fmt, dec->m_fmt, dec->fmt);
    for (i=0; i<dec->m_fmt; ++i) dec->fmt[i].p_free = 0;

    for (i=0; i<rec->n_fmt; i++)
    {
        ptr = bcf_unpack_fmt_core1(ptr, rec->n_sample, &dec->fmt[i]);
        src = dec->fmt[i].p - dec->fmt[i].size;
        if ( dst )
        {
            memmove(dec->fmt[i-1].p + dec->fmt[i-1].p_len, dec->fmt[i].p - dec->fmt[i].p_off, dec->fmt[i].p_off);
            dec->fmt[i].p = dec->fmt[i-1].p + dec->fmt[i-1].p_len + dec->fmt[i].p_off;
        }
        dst = dec->fmt[i].p;
        for (j=0; j<hdr->nsamples_ori; j++)
        {
            src += dec->fmt[i].size;
            if ( !bit_array_test(hdr->keep_samples,j) ) continue;
            memmove(dst, src, dec->fmt[i].size);
            dst += dec->fmt[i].size;
        }
        rec->indiv.l -= dec->fmt[i].p_len - (dst - dec->fmt[i].p);
        dec->fmt[i].p_len = dst - dec->fmt[i].p;
    }
    rec->unpacked |= BCF_UN_FMT;

    rec->n_sample = bcf_hdr_nsamples(hdr);
    return 0;
}